

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O0

DecoderBuffer * draco::parser::ParseLineIntoDecoderBuffer(DecoderBuffer *buffer)

{
  bool bVar1;
  DecoderBuffer *in_RSI;
  DecoderBuffer *in_RDI;
  char c;
  char *head;
  DecoderBuffer *out_buffer;
  char *in_stack_ffffffffffffffa8;
  DecoderBuffer *in_stack_ffffffffffffffb0;
  DecoderBuffer *this;
  char local_19;
  DecoderBuffer *local_18;
  DecoderBuffer *local_10;
  
  local_10 = in_RSI;
  local_18 = (DecoderBuffer *)DecoderBuffer::data_head(in_RSI);
  do {
    bVar1 = DecoderBuffer::Peek<char>(local_10,&local_19);
    if (!bVar1) break;
    DecoderBuffer::Advance(local_10,1);
  } while (local_19 != '\n');
  DecoderBuffer::DecoderBuffer(in_stack_ffffffffffffffb0);
  this = local_18;
  DecoderBuffer::data_head(local_10);
  DecoderBuffer::Init(this,in_stack_ffffffffffffffa8,0x12f07e);
  return in_RDI;
}

Assistant:

DecoderBuffer ParseLineIntoDecoderBuffer(DecoderBuffer *buffer) {
  const char *const head = buffer->data_head();
  char c;
  while (buffer->Peek(&c)) {
    // Skip the character.
    buffer->Advance(1);
    if (c == '\n') {
      break;  // End of the line reached.
    }
    if (c == '\r') {
      continue;  // Ignore extra line ending characters.
    }
  }
  DecoderBuffer out_buffer;
  out_buffer.Init(head, buffer->data_head() - head);
  return out_buffer;
}